

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mix.cpp
# Opt level: O0

void __thiscall Timidity::SF2Envelope::Init(SF2Envelope *this,Renderer *song,Voice *v)

{
  Voice *v_local;
  Renderer *song_local;
  SF2Envelope *this_local;
  
  (this->super_MinEnvelope).stage = '\0';
  this->volume = 0.0;
  this->DelayTime = (float)(int)(v->sample->envelope).sf2.delay_vol;
  this->AttackTime = (float)(int)(v->sample->envelope).sf2.attack_vol;
  this->HoldTime = (float)(int)(v->sample->envelope).sf2.hold_vol;
  this->DecayTime = (float)(int)(v->sample->envelope).sf2.decay_vol;
  this->SustainLevel = (float)(int)(v->sample->envelope).sf2.sustain_vol;
  this->ReleaseTime = (float)(int)(v->sample->envelope).sf2.release_vol;
  this->SampleRate = song->rate;
  this->HoldStart = 0;
  this->RateMul = (float)song->control_ratio / song->rate;
  this->RateMul_cB = this->RateMul * 960.0;
  (this->super_MinEnvelope).bUpdating = '\x01';
  return;
}

Assistant:

void SF2Envelope::Init(Renderer *song, Voice *v)
{
	stage = 0;
	volume = 0;
	DelayTime = v->sample->envelope.sf2.delay_vol;
	AttackTime = v->sample->envelope.sf2.attack_vol;
	HoldTime = v->sample->envelope.sf2.hold_vol;
	DecayTime = v->sample->envelope.sf2.decay_vol;
	SustainLevel = v->sample->envelope.sf2.sustain_vol;
	ReleaseTime = v->sample->envelope.sf2.release_vol;
	SampleRate = song->rate;
	HoldStart = 0;
	RateMul = song->control_ratio / song->rate;
	RateMul_cB = RateMul * 960;
	bUpdating = true;
}